

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns)

{
  xmlChar *pxVar1;
  xmlChar xVar2;
  xmlNsPtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  uint unaff_EBX;
  xmlChar *pxVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    uVar7 = 0;
    xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0);
  }
  else {
    pxVar5 = "";
    if (ns != (xmlNsPtr)0x0) {
      pxVar5 = "";
      if (ns->prefix != (xmlChar *)0x0) {
        pxVar5 = ns->prefix;
      }
    }
    pxVar4 = "";
    if (ns != (xmlNsPtr)0x0) {
      pxVar4 = "";
      if (ns->href != (xmlChar *)0x0) {
        pxVar4 = ns->href;
      }
    }
    if (*pxVar5 == '\0') {
      bVar11 = *pxVar4 == '\0';
    }
    else {
      bVar11 = false;
    }
    uVar7 = (uint)bVar11;
    if (cur->nsTab != (xmlNsPtr *)0x0) {
      if (bVar11 == false) {
        lVar8 = (long)cur->nsPrevStart;
      }
      else {
        lVar8 = 0;
      }
      lVar10 = (long)cur->nsCurEnd;
      do {
        lVar9 = lVar10;
        if (lVar9 <= lVar8) break;
        pxVar3 = cur->nsTab[lVar9 + -1];
        if (pxVar3 == (xmlNsPtr)0x0) {
          pxVar6 = (xmlChar *)0x0;
        }
        else {
          pxVar6 = pxVar3->prefix;
        }
        if (pxVar5 == pxVar6) {
          bVar11 = true;
        }
        else {
          bVar11 = *pxVar5 == '\0';
          if (pxVar6 != (xmlChar *)0x0) {
            lVar10 = 0;
            do {
              pxVar1 = pxVar5 + lVar10;
              xVar2 = pxVar6[lVar10];
              bVar11 = *pxVar1 == xVar2;
              if (xVar2 == '\0') break;
              lVar10 = lVar10 + 1;
            } while (*pxVar1 == xVar2);
          }
        }
        if (bVar11) {
          if (pxVar3 == (xmlNsPtr)0x0) {
            pxVar6 = (xmlChar *)0x0;
          }
          else {
            pxVar6 = pxVar3->href;
          }
          if (pxVar4 == pxVar6) {
            bVar12 = true;
          }
          else if (pxVar6 == (xmlChar *)0x0) {
            bVar12 = *pxVar4 == '\0';
          }
          else {
            lVar10 = 0;
            do {
              pxVar1 = pxVar4 + lVar10;
              xVar2 = pxVar6[lVar10];
              bVar12 = *pxVar1 == xVar2;
              if (xVar2 == '\0') break;
              lVar10 = lVar10 + 1;
            } while (*pxVar1 == xVar2);
          }
          unaff_EBX = (uint)bVar12;
        }
        lVar10 = lVar9 + -1;
      } while (!bVar11);
      if (lVar8 < lVar9) {
        return unaff_EBX;
      }
    }
  }
  return uVar7;
}

Assistant:

static int
xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns)
{
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam(NULL);
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = (has_empty_ns) ? 0 : cur->nsPrevStart;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		return(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL));
	    }
        }
    }
    return(has_empty_ns);
}